

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodeclass * LockModules(nodecontext *p,nodeclass *Class)

{
  char cVar1;
  fourcc_t ClassId_00;
  nodecontext *Module_00;
  nodeclass *pnVar2;
  int8_t State;
  nodemodule *Module;
  nodecontext *pnStack_38;
  fourcc_t ClassId;
  nodeclass *Class_local;
  nodecontext *p_local;
  long local_10;
  
  ClassId_00 = *(fourcc_t *)&Class[1].Meta;
  Module_00 = (nodecontext *)Class->Module;
  pnStack_38 = (nodecontext *)Class;
  if (Class->ParentClass == (nodeclass *)0x0) {
    if (Class->ParentId != 0) {
      return (nodeclass *)0x0;
    }
  }
  else {
    cVar1 = Class->State;
    pnVar2 = LockModules(p,Class->ParentClass);
    if (pnVar2 == (nodeclass *)0x0) {
      return (nodeclass *)0x0;
    }
    if (cVar1 < '\x01') {
      pnStack_38 = (nodecontext *)FindModuleClass(p,ClassId_00,(nodemodule *)Module_00);
    }
  }
  (Module_00->Base).Base.RefCount = (Module_00->Base).Base.RefCount + 1;
  if (((p == Module_00) || (p->LoadModule == (_func_bool_t_nodecontext_ptr_nodemodule_ptr *)0x0)) ||
     ((Module_00->Base).Module != (void *)0x0)) {
    local_10 = 0;
  }
  else {
    local_10 = (*p->LoadModule)(p,(nodemodule *)Module_00);
  }
  if (local_10 != 0) {
    NodeSingletonEvent(p,8,(nodemodule *)Module_00);
    pnStack_38 = (nodecontext *)FindModuleClass(p,ClassId_00,(nodemodule *)Module_00);
  }
  if (*(int8_t *)((long)&(pnStack_38->Base).Func + 5) < '\x01') {
    UnlockModules((nodeclass *)pnStack_38);
    p_local = (nodecontext *)0x0;
  }
  else {
    p_local = pnStack_38;
  }
  return (nodeclass *)p_local;
}

Assistant:

static NOINLINE const nodeclass* LockModules(nodecontext* p, const nodeclass* Class)
{
    fourcc_t ClassId = NodeClass_ClassId(Class);
    nodemodule* Module = Class->Module;

    if (!Class->ParentClass)
    {
        if (Class->ParentId)
            return NULL;
    }
    else
    {
        int8_t State = Class->State;

        if (!LockModules(p,Class->ParentClass))
            return NULL;

        if (State<CLASS_INITED)
            Class = FindModuleClass(p,ClassId,Module); // maybe have been reallocated
    }

    AddClassRef(Class);
    ++Module->Base.RefCount;

    if (CheckLoadModule(p,Module))
    {
        NodeSingletonEvent(p,NODE_SINGLETON_STARTUP,Module);
        Class = FindModuleClass(p,ClassId,Module); // maybe have been reallocated
    }

    if (Class->State<CLASS_INITED)
    {
        UnlockModules(Class);
        return NULL;
    }

    return Class;
}